

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O1

void lj_ccallback_mcode_free(CTState *cts)

{
  void *__addr;
  
  __addr = (cts->cb).mcode;
  if (__addr != (void *)0x0) {
    munmap(__addr,0x1000);
    return;
  }
  return;
}

Assistant:

void lj_ccallback_mcode_free(CTState *cts)
{
  size_t sz = (size_t)CALLBACK_MCODE_SIZE;
  void *p = cts->cb.mcode;
  if (p == NULL) return;
#if LJ_TARGET_WINDOWS
  VirtualFree(p, 0, MEM_RELEASE);
  UNUSED(sz);
#elif LJ_TARGET_POSIX
  munmap(p, sz);
#else
  lj_mem_free(cts->g, p, sz);
#endif
}